

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O0

int secp256k1_pedersen_blind_generator_blind_sum
              (secp256k1_context *ctx,uint64_t *value,uchar **generator_blind,
              uchar **blinding_factor,size_t n_total,size_t n_inputs)

{
  long in_RCX;
  long in_RDX;
  long in_RSI;
  secp256k1_scalar *in_R8;
  secp256k1_scalar *in_R9;
  secp256k1_scalar addend;
  int overflow;
  size_t i;
  secp256k1_scalar tmp;
  secp256k1_scalar sum;
  char *in_stack_ffffffffffffff48;
  undefined5 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff55;
  undefined1 uVar1;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 uVar2;
  undefined1 uVar3;
  secp256k1_scalar *in_stack_ffffffffffffff58;
  secp256k1_scalar *in_stack_ffffffffffffff60;
  secp256k1_scalar *in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  secp256k1_scalar *r;
  secp256k1_scalar *in_stack_ffffffffffffff88;
  secp256k1_scalar *in_stack_ffffffffffffff90;
  secp256k1_scalar local_58;
  secp256k1_scalar *local_30;
  long local_28;
  long local_18;
  int local_4;
  
  uVar3 = in_R8 == (secp256k1_scalar *)0x0 || in_RSI != 0;
  if (in_R8 == (secp256k1_scalar *)0x0 || in_RSI != 0) {
    uVar2 = in_R8 == (secp256k1_scalar *)0x0 || in_RDX != 0;
    if (in_R8 == (secp256k1_scalar *)0x0 || in_RDX != 0) {
      uVar1 = in_R8 == (secp256k1_scalar *)0x0 || in_RCX != 0;
      if (in_R8 == (secp256k1_scalar *)0x0 || in_RCX != 0) {
        if (in_R9 < in_R8) {
          if (in_R8 == (secp256k1_scalar *)0x0) {
            local_4 = 1;
          }
          else {
            local_30 = in_R8;
            local_28 = in_RCX;
            local_18 = in_RSI;
            secp256k1_scalar_set_int(&local_58,0);
            for (r = (secp256k1_scalar *)0x0; r < local_30; r = (secp256k1_scalar *)((long)r->d + 1)
                ) {
              in_stack_ffffffffffffff7c = 0;
              secp256k1_scalar_set_u64
                        ((secp256k1_scalar *)&stack0xffffffffffffff58,
                         *(uint64_t *)(local_18 + (long)r * 8));
              secp256k1_scalar_set_b32
                        (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,
                         (int *)CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,
                                                  in_stack_ffffffffffffff50))));
              if (in_stack_ffffffffffffff7c == 1) {
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff88);
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff58);
                secp256k1_scalar_clear(&local_58);
                return 0;
              }
              secp256k1_scalar_mul(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,r);
              secp256k1_scalar_set_b32
                        (in_stack_ffffffffffffff60,(uchar *)in_stack_ffffffffffffff58,
                         (int *)CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,
                                                  in_stack_ffffffffffffff50))));
              if (in_stack_ffffffffffffff7c == 1) {
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff88);
                secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff58);
                secp256k1_scalar_clear(&local_58);
                return 0;
              }
              secp256k1_scalar_add
                        (r,(secp256k1_scalar *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70);
              secp256k1_scalar_cond_negate(r,in_stack_ffffffffffffff7c);
              secp256k1_scalar_add
                        (r,(secp256k1_scalar *)
                           CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                         in_stack_ffffffffffffff70);
              secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff58);
            }
            secp256k1_scalar_negate(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
            secp256k1_scalar_add
                      (r,(secp256k1_scalar *)
                         CONCAT44(in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78),
                       in_stack_ffffffffffffff70);
            secp256k1_scalar_get_b32
                      (*(uchar **)(local_28 + (long)((long)local_30[-1].d + 0x1f) * 8),
                       (secp256k1_scalar *)&stack0xffffffffffffff88);
            secp256k1_scalar_clear((secp256k1_scalar *)&stack0xffffffffffffff88);
            secp256k1_scalar_clear(&local_58);
            local_4 = 1;
          }
        }
        else {
          secp256k1_callback_call
                    ((secp256k1_callback *)
                     CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,in_stack_ffffffffffffff50))),
                     in_stack_ffffffffffffff48);
          local_4 = 0;
        }
      }
      else {
        secp256k1_callback_call
                  ((secp256k1_callback *)
                   CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(uVar1,in_stack_ffffffffffffff50))),
                   in_stack_ffffffffffffff48);
        local_4 = 0;
      }
    }
    else {
      secp256k1_callback_call
                ((secp256k1_callback *)
                 CONCAT17(uVar3,CONCAT16(uVar2,CONCAT15(in_stack_ffffffffffffff55,
                                                        in_stack_ffffffffffffff50))),
                 in_stack_ffffffffffffff48);
      local_4 = 0;
    }
  }
  else {
    secp256k1_callback_call
              ((secp256k1_callback *)
               CONCAT17(uVar3,CONCAT16(in_stack_ffffffffffffff56,
                                       CONCAT15(in_stack_ffffffffffffff55,in_stack_ffffffffffffff50)
                                      )),in_stack_ffffffffffffff48);
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int secp256k1_pedersen_blind_generator_blind_sum(const secp256k1_context* ctx, const uint64_t *value, const unsigned char* const* generator_blind, unsigned char* const* blinding_factor, size_t n_total, size_t n_inputs) {
    secp256k1_scalar sum;
    secp256k1_scalar tmp;
    size_t i;

    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(n_total == 0 || value != NULL);
    ARG_CHECK(n_total == 0 || generator_blind != NULL);
    ARG_CHECK(n_total == 0 || blinding_factor != NULL);
    ARG_CHECK(n_total > n_inputs);
    (void) ctx;

    if (n_total == 0) {
        return 1;
    }

    secp256k1_scalar_set_int(&sum, 0);
    for (i = 0; i < n_total; i++) {
        int overflow = 0;
        secp256k1_scalar addend;
        secp256k1_scalar_set_u64(&addend, value[i]);  /* s = v */

        secp256k1_scalar_set_b32(&tmp, generator_blind[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_mul(&addend, &addend, &tmp); /* s = vr */

        secp256k1_scalar_set_b32(&tmp, blinding_factor[i], &overflow);
        if (overflow == 1) {
            secp256k1_scalar_clear(&tmp);
            secp256k1_scalar_clear(&addend);
            secp256k1_scalar_clear(&sum);
            return 0;
        }
        secp256k1_scalar_add(&addend, &addend, &tmp); /* s = vr + r' */
        secp256k1_scalar_cond_negate(&addend, i < n_inputs);  /* s is negated if it's an input */
        secp256k1_scalar_add(&sum, &sum, &addend);    /* sum += s */
        secp256k1_scalar_clear(&addend);
    }

    /* Right now tmp has the last pedersen blinding factor. Subtract the sum from it. */
    secp256k1_scalar_negate(&sum, &sum);
    secp256k1_scalar_add(&tmp, &tmp, &sum);
    secp256k1_scalar_get_b32(blinding_factor[n_total - 1], &tmp);

    secp256k1_scalar_clear(&tmp);
    secp256k1_scalar_clear(&sum);
    return 1;
}